

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_ctpop_i32_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1)

{
  TCGv_i64 ret_00;
  TCGv_i64 t;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  if (have_popcnt_m68k) {
    tcg_gen_op2_i32(tcg_ctx,INDEX_op_ctpop_i32,ret,arg1);
  }
  else if (have_popcnt_m68k) {
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64_m68k(tcg_ctx,ret_00,arg1);
    tcg_gen_ctpop_i64_m68k(tcg_ctx,ret_00,ret_00);
    tcg_gen_extrl_i64_i32_m68k(tcg_ctx,ret,ret_00);
    tcg_temp_free_i64(tcg_ctx,ret_00);
  }
  else {
    gen_helper_ctpop_i32(tcg_ctx,ret,arg1);
  }
  return;
}

Assistant:

void tcg_gen_ctpop_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1)
{
    if (TCG_TARGET_HAS_ctpop_i32) {
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_ctpop_i32, ret, arg1);
    } else if (TCG_TARGET_HAS_ctpop_i64) {
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, t, arg1);
        tcg_gen_ctpop_i64(tcg_ctx, t, t);
        tcg_gen_extrl_i64_i32(tcg_ctx, ret, t);
        tcg_temp_free_i64(tcg_ctx, t);
    } else {
        gen_helper_ctpop_i32(tcg_ctx, ret, arg1);
    }
}